

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

unique_ptr<CMipsInstruction,_std::default_delete<CMipsInstruction>_> __thiscall
MipsParser::parseOpcode(MipsParser *this,Parser *parser)

{
  uint uVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  bool bVar4;
  Token *pTVar5;
  ulong uVar6;
  Parser *in_RDX;
  tMipsOpcode *opcode;
  bool bVar7;
  CMipsInstruction *local_68;
  
  pTVar5 = Tokenizer::peekToken
                     ((in_RDX->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar5->type == Identifier) {
    pTVar5 = Tokenizer::nextToken
                       ((in_RDX->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
    if (*(__index_type *)
         ((long)&(pTVar5->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') {
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    local_68 = *(CMipsInstruction **)&(this->registers).grs;
    opcode = MipsOpcodes;
    bVar7 = false;
    uVar6 = (ulong)Mips.Version;
    bVar3 = false;
    do {
      if (((((((mipsArchs[uVar6].supportSets & opcode->archs) != 0) &&
             ((mipsArchs[uVar6].excludeMask & opcode->archs) == 0)) &&
            ((uVar1 = opcode->flags, (uVar1 >> 0xc & 1) == 0 ||
             ((mipsArchs[uVar6].flags & 0x1000) != 0)))) &&
           (((uVar1 >> 0xd & 1) == 0 || ((mipsArchs[uVar6].flags & 0x2000) != 0)))) &&
          (((uVar1 >> 0xe & 1) == 0 || ((mipsArchs[uVar6].flags & 0x4000) != 0)))) &&
         (bVar4 = decodeOpcode((MipsParser *)parser,(string *)&pTVar5->value,opcode), bVar4)) {
        p_Var2 = (((in_RDX->entries).
                   super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node;
        bVar4 = parseParameters((MipsParser *)parser,in_RDX,opcode);
        if (bVar4) {
          local_68 = (CMipsInstruction *)operator_new(0x400);
          CMipsInstruction::CMipsInstruction
                    (local_68,(MipsOpcodeData *)
                              &parser[5].macros._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (MipsImmediateData *)
                     &parser[4].conditionStack.
                      super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(MipsRegisterData *)parser);
          break;
        }
        (((in_RDX->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node = p_Var2;
        bVar3 = true;
      }
      bVar7 = opcode[1].name == (char *)0x0;
      opcode = opcode + 1;
    } while (!bVar7);
    *(CMipsInstruction **)&(this->registers).grs = local_68;
    if (!bVar7) {
      return (unique_ptr<CMipsInstruction,_std::default_delete<CMipsInstruction>_>)this;
    }
    if (bVar3) {
      Parser::printError<>(in_RDX,pTVar5,"MIPS parameter failure");
    }
    else {
      Parser::printError<Identifier>
                (in_RDX,pTVar5,"Invalid MIPS opcode \'%s\'",(Identifier *)&pTVar5->value);
    }
  }
  *(undefined8 *)&(this->registers).grs = 0;
  return (__uniq_ptr_data<CMipsInstruction,_std::default_delete<CMipsInstruction>,_true,_true>)
         (__uniq_ptr_data<CMipsInstruction,_std::default_delete<CMipsInstruction>,_true,_true>)this;
}

Assistant:

std::unique_ptr<CMipsInstruction> MipsParser::parseOpcode(Parser& parser)
{
	if (parser.peekToken().type != TokenType::Identifier)
		return nullptr;

	const Token &token = parser.nextToken();

	bool paramFail = false;
	const MipsArchDefinition& arch = mipsArchs[Mips.GetVersion()];
	const Identifier &identifier = token.identifierValue();

	for (int z = 0; MipsOpcodes[z].name != nullptr; z++)
	{
		if ((MipsOpcodes[z].archs & arch.supportSets) == 0)
			continue;
		if ((MipsOpcodes[z].archs & arch.excludeMask) != 0)
			continue;

		if ((MipsOpcodes[z].flags & MO_64BIT) && !(arch.flags & MO_64BIT))
			continue;
		if ((MipsOpcodes[z].flags & MO_FPU) && !(arch.flags & MO_FPU))
			continue;
		if ((MipsOpcodes[z].flags & MO_DFPU) && !(arch.flags & MO_DFPU))
			continue;

		if (decodeOpcode(identifier.string(),MipsOpcodes[z]))
		{
			TokenizerPosition tokenPos = parser.getTokenizer()->getPosition();

			if (parseParameters(parser,MipsOpcodes[z]))
			{
				// success, return opcode
				return std::make_unique<CMipsInstruction>(opcodeData,immediate,registers);
			}

			parser.getTokenizer()->setPosition(tokenPos);
			paramFail = true;
		}
	}

	if (paramFail)
		parser.printError(token, "MIPS parameter failure");
	else
		parser.printError(token, "Invalid MIPS opcode '%s'",identifier);

	return nullptr;
}